

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void __thiscall crnlib::crn_comp::optimize_alpha_selectors(crn_comp *this)

{
  unsigned_short uVar1;
  unsigned_long_long uVar2;
  ushort uVar3;
  uint uVar4;
  vector<unsigned_short> *this_00;
  unsigned_long_long *puVar5;
  unsigned_short *puVar6;
  ulong local_1090;
  uint64 j;
  uint64 delta_selector;
  uint64 selector;
  uint error;
  ushort local_106c;
  uint16 i_2;
  uint min_error;
  uint16 selected_index;
  uint16 left;
  uint64 selected_selector;
  uint16 i_1;
  undefined1 local_1050 [8];
  vector<unsigned_short> indices;
  vector<unsigned_long_long> selectors;
  byte abStack_1028 [6];
  uint16 i;
  uint8 D6 [4096];
  uint8 d [8];
  uint16 n;
  vector<unsigned_short> *remapping;
  crn_comp *this_local;
  
  this_00 = this->m_selector_remaping + 1;
  uVar4 = vector<unsigned_long_long>::size(&this->m_alpha_selectors);
  uVar3 = (ushort)uVar4;
  vector<unsigned_short>::resize(this_00,uVar4 & 0xffff,false);
  stack0xffffffffffffffde = 0x404050503030200;
  for (selectors.m_capacity._2_2_ = 0; selectors.m_capacity._2_2_ < 0x1000;
      selectors.m_capacity._2_2_ = selectors.m_capacity._2_2_ + 1) {
    abStack_1028[selectors.m_capacity._2_2_] =
         D6[(long)(int)(((uint)selectors.m_capacity._2_2_ ^
                        (int)(uint)selectors.m_capacity._2_2_ >> 6) & 7) + 0xffe] +
         D6[(long)(int)(((int)(uint)selectors.m_capacity._2_2_ >> 3 ^
                        (int)(uint)selectors.m_capacity._2_2_ >> 9) & 7) + 0xffe];
  }
  vector<unsigned_long_long>::vector((vector<unsigned_long_long> *)&indices.m_size,uVar4 & 0xffff);
  vector<unsigned_short>::vector((vector<unsigned_short> *)local_1050,uVar4 & 0xffff);
  for (selected_selector._2_2_ = 0; selected_selector._2_2_ < uVar3;
      selected_selector._2_2_ = selected_selector._2_2_ + 1) {
    puVar5 = vector<unsigned_long_long>::operator[]
                       (&this->m_alpha_selectors,(uint)selected_selector._2_2_);
    uVar2 = *puVar5;
    puVar5 = vector<unsigned_long_long>::operator[]
                       ((vector<unsigned_long_long> *)&indices.m_size,(uint)selected_selector._2_2_)
    ;
    *puVar5 = uVar2;
    puVar6 = vector<unsigned_short>::operator[]
                       ((vector<unsigned_short> *)local_1050,(uint)selected_selector._2_2_);
    *puVar6 = selected_selector._2_2_;
  }
  _min_error = 0;
  i_2 = uVar3;
  while (i_2 != 0) {
    local_106c = 0;
    error = 0xffffffff;
    for (selector._6_2_ = 0; selector._6_2_ < i_2; selector._6_2_ = selector._6_2_ + 1) {
      selector._0_4_ = 0;
      puVar5 = vector<unsigned_long_long>::operator[]
                         ((vector<unsigned_long_long> *)&indices.m_size,(uint)selector._6_2_);
      delta_selector = *puVar5 << 6;
      j = _min_error;
      for (local_1090 = 0; local_1090 < 8; local_1090 = local_1090 + 1) {
        selector._0_4_ = abStack_1028[delta_selector & 0xfc0 | j & 0x3f] + (uint)selector;
        delta_selector = delta_selector >> 6;
        j = j >> 6;
      }
      if ((uint)selector < error) {
        error = (uint)selector;
        local_106c = selector._6_2_;
      }
    }
    puVar5 = vector<unsigned_long_long>::operator[]
                       ((vector<unsigned_long_long> *)&indices.m_size,(uint)local_106c);
    _min_error = *puVar5;
    puVar6 = vector<unsigned_short>::operator[]
                       ((vector<unsigned_short> *)local_1050,(uint)local_106c);
    puVar6 = vector<unsigned_short>::operator[](this_00,(uint)*puVar6);
    *puVar6 = uVar3 - i_2;
    i_2 = i_2 - 1;
    puVar5 = vector<unsigned_long_long>::operator[]
                       ((vector<unsigned_long_long> *)&indices.m_size,(uint)i_2);
    uVar2 = *puVar5;
    puVar5 = vector<unsigned_long_long>::operator[]
                       ((vector<unsigned_long_long> *)&indices.m_size,(uint)local_106c);
    *puVar5 = uVar2;
    puVar6 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)local_1050,(uint)i_2);
    uVar1 = *puVar6;
    puVar6 = vector<unsigned_short>::operator[]
                       ((vector<unsigned_short> *)local_1050,(uint)local_106c);
    *puVar6 = uVar1;
  }
  pack_alpha_selectors(this,&this->m_packed_alpha_selectors,this_00);
  vector<unsigned_short>::~vector((vector<unsigned_short> *)local_1050);
  vector<unsigned_long_long>::~vector((vector<unsigned_long_long> *)&indices.m_size);
  return;
}

Assistant:

void crn_comp::optimize_alpha_selectors() {
  crnlib::vector<uint16>& remapping = m_selector_remaping[cAlpha0];
  uint16 n = m_alpha_selectors.size();
  remapping.resize(n);

  uint8 d[] = {0, 2, 3, 3, 5, 5, 4, 4};

  uint8 D6[0x1000];
  for (uint16 i = 0; i < 0x1000; i++)
    D6[i] = d[(i ^ i >> 6) & 7] + d[(i >> 3 ^ i >> 9) & 7];

  crnlib::vector<uint64> selectors(n);
  crnlib::vector<uint16> indices(n);
  for (uint16 i = 0; i < n; i++) {
    selectors[i] = m_alpha_selectors[i];
    indices[i] = i;
  }
  uint64 selected_selector = 0;
  for (uint16 left = n; left;) {
    uint16 selected_index = 0;
    uint min_error = cUINT32_MAX;
    for (uint16 i = 0; i < left; i++) {
      uint error = 0;
      for (uint64 selector = selectors[i] << 6, delta_selector = selected_selector, j = 0; j < 8; j++, selector >>= 6, delta_selector >>= 6)
        error += D6[(selector & 0xFC0) | (delta_selector & 0x3F)];
      if (error < min_error) {
        min_error = error;
        selected_index = i;
      }
    }
    selected_selector = selectors[selected_index];
    remapping[indices[selected_index]] = n - left;
    left--;
    selectors[selected_index] = selectors[left];
    indices[selected_index] = indices[left];
  }

  pack_alpha_selectors(m_packed_alpha_selectors, remapping);
}